

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O1

string * __thiscall
duckdb::QueryProfiler::ToJSON_abi_cxx11_(string *__return_storage_ptr__,QueryProfiler *this)

{
  yyjson_mut_val *pyVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  yyjson_mut_doc *doc;
  pointer pPVar5;
  reference pvVar6;
  yyjson_mut_val *pyVar7;
  undefined8 in_RCX;
  undefined7 uVar9;
  yyjson_mut_val *pyVar8;
  char *pcVar10;
  yyjson_mut_val *pyVar11;
  yyjson_val_pool *pyVar12;
  yyjson_mut_doc *doc_00;
  _Head_base<0UL,_duckdb::ProfilingNode_*,_false> local_40;
  yyjson_val_pool *local_38;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar4 != 0) {
    ::std::__throw_system_error(iVar4);
  }
  doc = duckdb_yyjson::yyjson_mut_doc_new((yyjson_alc *)0x0);
  if (doc == (yyjson_mut_doc *)0x0) {
LAB_004e64c7:
    doc_00 = (yyjson_mut_doc *)0x0;
  }
  else {
    pyVar12 = &doc->val_pool;
    if (((doc->val_pool).end != (doc->val_pool).cur) ||
       (bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar12,&doc->alc,1), bVar3)) {
      doc_00 = (yyjson_mut_doc *)pyVar12->cur;
      pyVar12->cur = (yyjson_mut_val *)((yyjson_val_uni *)&doc_00->alc + 2);
    }
    else {
      doc_00 = (yyjson_mut_doc *)0x0;
    }
    if (doc_00 == (yyjson_mut_doc *)0x0) goto LAB_004e64c7;
    doc_00->root = (yyjson_mut_val *)0x7;
  }
  if (doc != (yyjson_mut_doc *)0x0) {
    doc->root = (yyjson_mut_val *)doc_00;
  }
  uVar9 = (undefined7)((ulong)in_RCX >> 8);
  if (((this->query_info).query_name._M_string_length == 0) &&
     ((this->root).
      super_unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>._M_t.
      super___uniq_ptr_impl<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::ProfilingNode_*,_std::default_delete<duckdb::ProfilingNode>_>.
      super__Head_base<0UL,_duckdb::ProfilingNode_*,_false>._M_head_impl == (ProfilingNode *)0x0)) {
    pyVar8 = (yyjson_mut_val *)
             CONCAT71(uVar9,doc_00 == (yyjson_mut_doc *)0x0 || doc == (yyjson_mut_doc *)0x0);
    if ((doc_00 != (yyjson_mut_doc *)0x0 && doc != (yyjson_mut_doc *)0x0) &&
       ((~*(uint *)&doc_00->root & 7) == 0)) {
      pyVar12 = &doc->val_pool;
      pyVar8 = (yyjson_mut_val *)
               (((long)(doc->val_pool).end - (long)(doc->val_pool).cur >> 3) * -0x5555555555555555);
      if (((yyjson_mut_val *)&DAT_00000001 < pyVar8) ||
         (bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar12,&doc->alc,2), bVar3)) {
        pyVar7 = pyVar12->cur;
        pyVar8 = pyVar7 + 2;
        pyVar12->cur = pyVar8;
      }
      else {
        pyVar7 = (yyjson_mut_val *)0x0;
      }
      if (pyVar7 != (yyjson_mut_val *)0x0) {
        pyVar1 = doc_00->root;
        pyVar7->tag = 0x60d;
        (pyVar7->uni).str = "result";
        pyVar7[1].tag = 0x50d;
        pcVar10 = "empty";
LAB_004e6347:
        pyVar8 = (yyjson_mut_val *)((ulong)pyVar1 & 0xffffffffffffff00);
        pyVar7[1].uni.str = pcVar10;
        pyVar11 = pyVar7;
        if ((yyjson_mut_val *)0xff < pyVar1) {
          lVar2 = *(long *)((doc_00->alc).malloc + 0x10);
          pyVar11 = *(yyjson_mut_val **)(lVar2 + 0x10);
          *(yyjson_mut_val **)(lVar2 + 0x10) = pyVar7;
        }
        pyVar7[1].next = pyVar11;
        pyVar7->next = pyVar7 + 1;
        (doc_00->alc).malloc = (_func_void_ptr_void_ptr_size_t *)pyVar7;
        doc_00->root = (yyjson_mut_val *)((long)&pyVar8[10].next + (ulong)*(byte *)&doc_00->root);
      }
    }
  }
  else {
    if ((this->root).
        super_unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>._M_t.
        super___uniq_ptr_impl<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::ProfilingNode_*,_std::default_delete<duckdb::ProfilingNode>_>
        .super__Head_base<0UL,_duckdb::ProfilingNode_*,_false>._M_head_impl != (ProfilingNode *)0x0)
    {
      pPVar5 = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>::
               operator->(&this->root);
      ProfilingInfo::WriteMetricsToJSON(&pPVar5->profiling_info,doc,(yyjson_mut_val *)doc_00);
      if (doc == (yyjson_mut_doc *)0x0) {
LAB_004e6536:
        pyVar8 = (yyjson_mut_val *)0x0;
      }
      else {
        pyVar12 = &doc->val_pool;
        if (((doc->val_pool).end != (doc->val_pool).cur) ||
           (bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar12,&doc->alc,1), bVar3)) {
          pyVar8 = pyVar12->cur;
          pyVar12->cur = pyVar8 + 1;
        }
        else {
          pyVar8 = (yyjson_mut_val *)0x0;
        }
        if (pyVar8 == (yyjson_mut_val *)0x0) goto LAB_004e6536;
        pyVar8->tag = 6;
      }
      if (((doc_00 != (yyjson_mut_doc *)0x0 && pyVar8 != (yyjson_mut_val *)0x0) &&
           doc != (yyjson_mut_doc *)0x0) && ((~*(uint *)&doc_00->root & 7) == 0)) {
        pyVar12 = &doc->val_pool;
        if ((1 < (ulong)(((long)(doc->val_pool).end - (long)(doc->val_pool).cur >> 3) *
                        -0x5555555555555555)) ||
           (local_38 = pyVar12,
           bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar12,&doc->alc,2),
           pyVar12 = local_38, bVar3)) {
          pyVar12->cur = pyVar12->cur + 2;
        }
        ToJSON_abi_cxx11_();
      }
      pPVar5 = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>::
               operator->(&this->root);
      pvVar6 = vector<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>,_true>
               ::operator[](&pPVar5->children,0);
      local_40._M_head_impl =
           (pvVar6->
           super_unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>).
           _M_t.
           super___uniq_ptr_impl<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ProfilingNode_*,_std::default_delete<duckdb::ProfilingNode>_>
           .super__Head_base<0UL,_duckdb::ProfilingNode_*,_false>._M_head_impl;
      optional_ptr<duckdb::ProfilingNode,_true>::CheckValid
                ((optional_ptr<duckdb::ProfilingNode,_true> *)&local_40);
      ToJSONRecursive(doc,local_40._M_head_impl);
      ToJSON_abi_cxx11_();
      StringifyAndFree_abi_cxx11_(__return_storage_ptr__,(duckdb *)doc,doc_00,pyVar8);
      goto LAB_004e6395;
    }
    pyVar8 = (yyjson_mut_val *)
             CONCAT71(uVar9,doc_00 == (yyjson_mut_doc *)0x0 || doc == (yyjson_mut_doc *)0x0);
    if ((doc_00 != (yyjson_mut_doc *)0x0 && doc != (yyjson_mut_doc *)0x0) &&
       ((~*(uint *)&doc_00->root & 7) == 0)) {
      pyVar12 = &doc->val_pool;
      pyVar8 = (yyjson_mut_val *)
               (((long)(doc->val_pool).end - (long)(doc->val_pool).cur >> 3) * -0x5555555555555555);
      if (((yyjson_mut_val *)&DAT_00000001 < pyVar8) ||
         (bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar12,&doc->alc,2), bVar3)) {
        pyVar7 = pyVar12->cur;
        pyVar8 = pyVar7 + 2;
        pyVar12->cur = pyVar8;
      }
      else {
        pyVar7 = (yyjson_mut_val *)0x0;
      }
      if (pyVar7 != (yyjson_mut_val *)0x0) {
        pyVar1 = doc_00->root;
        pyVar7->tag = 0x60d;
        (pyVar7->uni).str = "result";
        pyVar7[1].tag = 0x50d;
        pcVar10 = "error";
        goto LAB_004e6347;
      }
    }
  }
  StringifyAndFree_abi_cxx11_(__return_storage_ptr__,(duckdb *)doc,doc_00,pyVar8);
LAB_004e6395:
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return __return_storage_ptr__;
}

Assistant:

string QueryProfiler::ToJSON() const {
	lock_guard<std::mutex> guard(lock);
	auto doc = yyjson_mut_doc_new(nullptr);
	auto result_obj = yyjson_mut_obj(doc);
	yyjson_mut_doc_set_root(doc, result_obj);

	if (query_info.query_name.empty() && !root) {
		yyjson_mut_obj_add_str(doc, result_obj, "result", "empty");
		return StringifyAndFree(doc, result_obj);
	}
	if (!root) {
		yyjson_mut_obj_add_str(doc, result_obj, "result", "error");
		return StringifyAndFree(doc, result_obj);
	}

	auto &settings = root->GetProfilingInfo();

	settings.WriteMetricsToJSON(doc, result_obj);

	// recursively print the physical operator tree
	auto children_list = yyjson_mut_arr(doc);
	yyjson_mut_obj_add_val(doc, result_obj, "children", children_list);
	auto child = ToJSONRecursive(doc, *root->GetChild(0));
	yyjson_mut_arr_add_val(children_list, child);
	return StringifyAndFree(doc, result_obj);
}